

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_slice.c
# Opt level: O3

int h264_sub_mb_pred(bitstream *str,h264_cabac_context *cabac,h264_slice *slice,h264_macroblock *mb)

{
  uint32_t *val;
  int iVar1;
  int iVar2;
  int32_t iVar3;
  long lVar4;
  long lVar5;
  uint32_t (*pauVar6) [4];
  int32_t *piVar7;
  uint32_t uVar8;
  uint uVar9;
  int pmode [4];
  int ifrom [16];
  byte abStack_88 [16];
  int iStack_78;
  undefined8 local_74;
  int aiStack_6c [15];
  
  lVar5 = 0;
  do {
    val = (uint32_t *)((long)mb->sub_mb_type + lVar5);
    iVar1 = h264_sub_mb_type(str,cabac,slice->slice_type,val);
    if (iVar1 != 0) {
      return 1;
    }
    uVar9 = *val;
    iVar1 = sub_mb_part_info[uVar9][0];
    *(int *)(abStack_88 + lVar5) = sub_mb_part_info[uVar9][1];
    (&iStack_78)[lVar5] = -1;
    iVar2 = (int)lVar5;
    switch(iVar1) {
    case 0:
      aiStack_6c[lVar5 + -2] = iVar2;
      aiStack_6c[lVar5 + -1] = iVar2;
      aiStack_6c[lVar5] = iVar2;
      break;
    case 1:
      aiStack_6c[lVar5 + -2] = iVar2;
      aiStack_6c[lVar5 + -1] = -1;
      iVar2 = iVar2 + 2;
      goto LAB_001069d6;
    case 2:
      aiStack_6c[lVar5 + -2] = -1;
      aiStack_6c[lVar5 + -1] = iVar2;
      iVar2 = iVar2 + 1;
LAB_001069d6:
      aiStack_6c[lVar5] = iVar2;
      break;
    case 3:
      (aiStack_6c + lVar5 + -2)[0] = -1;
      (aiStack_6c + lVar5 + -2)[1] = -1;
      aiStack_6c[lVar5] = -1;
    }
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0x10);
  uVar8 = slice->num_ref_idx_l0_active_minus1;
  if ((slice->mbaff_frame_flag != 0) && (mb->mb_field_decoding_flag != 0)) {
    uVar8 = uVar8 * 2 + 1;
  }
  pauVar6 = mb->ref_idx;
  lVar5 = 0;
  do {
    if (((abStack_88[lVar5 * 4] & 1) == 0) || (mb->mb_type == 0x1f)) {
      iVar1 = vs_infer(str,*pauVar6,0);
    }
    else {
      iVar1 = h264_ref_idx(str,cabac,(int)lVar5,0,uVar8,*pauVar6);
    }
    if (iVar1 != 0) {
      return 1;
    }
    lVar5 = lVar5 + 1;
    pauVar6 = (uint32_t (*) [4])(*pauVar6 + 1);
  } while (lVar5 != 4);
  uVar8 = slice->num_ref_idx_l1_active_minus1;
  if ((slice->mbaff_frame_flag != 0) && (mb->mb_field_decoding_flag != 0)) {
    uVar8 = uVar8 * 2 + 1;
  }
  pauVar6 = mb->ref_idx + 1;
  lVar5 = 0;
  do {
    if ((abStack_88[lVar5 * 4] & 2) == 0) {
      iVar1 = vs_infer(str,*pauVar6,0);
      if (iVar1 != 0) {
        return 1;
      }
    }
    else {
      iVar1 = h264_ref_idx(str,cabac,(int)lVar5,1,uVar8,*pauVar6);
      if (iVar1 != 0) {
        return 1;
      }
    }
    lVar5 = lVar5 + 1;
    pauVar6 = (uint32_t (*) [4])(*pauVar6 + 1);
  } while (lVar5 != 4);
  piVar7 = mb->mvd[0][0] + 1;
  lVar5 = 0;
  do {
    lVar4 = (long)(&iStack_78)[lVar5];
    if (lVar4 == -1) {
      uVar9 = (uint)lVar5;
      if ((abStack_88[uVar9 & 0xfffffffc] & 1) == 0) {
        iVar1 = vs_infers(str,piVar7 + -1,0);
        if (iVar1 != 0) {
          return 1;
        }
        iVar3 = 0;
        goto LAB_00106b63;
      }
      iVar1 = h264_mvd(str,cabac,uVar9,0,0,(int32_t *)(piVar7 + -1));
      if (iVar1 != 0) {
        return 1;
      }
      iVar1 = h264_mvd(str,cabac,uVar9,1,0,piVar7);
      if (iVar1 != 0) {
        return 1;
      }
    }
    else {
      iVar1 = vs_infers(str,(int32_t *)(piVar7 + -1),mb->mvd[0][lVar4][0]);
      if (iVar1 != 0) {
        return 1;
      }
      iVar3 = mb->mvd[0][lVar4][1];
LAB_00106b63:
      iVar1 = vs_infers(str,piVar7,iVar3);
      if (iVar1 != 0) {
        return 1;
      }
    }
    lVar5 = lVar5 + 1;
    piVar7 = piVar7 + 2;
  } while (lVar5 != 0x10);
  piVar7 = mb->mvd[1][0] + 1;
  lVar5 = 0;
  do {
    lVar4 = (long)(&iStack_78)[lVar5];
    if (lVar4 == -1) {
      uVar9 = (uint)lVar5;
      if ((abStack_88[uVar9 & 0xfffffffc] & 2) == 0) {
        iVar1 = vs_infers(str,piVar7 + -1,0);
        if (iVar1 != 0) {
          return 1;
        }
        iVar3 = 0;
        goto LAB_00106c32;
      }
      iVar1 = h264_mvd(str,cabac,uVar9,0,1,(int32_t *)(piVar7 + -1));
      if (iVar1 != 0) {
        return 1;
      }
      iVar1 = h264_mvd(str,cabac,uVar9,1,1,piVar7);
      if (iVar1 != 0) {
        return 1;
      }
    }
    else {
      iVar1 = vs_infers(str,(int32_t *)(piVar7 + -1),mb->mvd[1][lVar4][0]);
      if (iVar1 != 0) {
        return 1;
      }
      iVar3 = (*(int32_t (*) [16] [2])(mb->block_luma_dc + -2))[lVar4][1];
LAB_00106c32:
      iVar1 = vs_infers(str,piVar7,iVar3);
      if (iVar1 != 0) {
        return 1;
      }
    }
    lVar5 = lVar5 + 1;
    piVar7 = piVar7 + 2;
    if (lVar5 == 0x10) {
      iVar1 = vs_infer(str,&mb->intra_chroma_pred_mode,0);
      return (uint)(iVar1 != 0);
    }
  } while( true );
}

Assistant:

int h264_sub_mb_pred(struct bitstream *str, struct h264_cabac_context *cabac, struct h264_slice *slice, struct h264_macroblock *mb) {
	int i;
	int pmode[4];
	int ifrom[16];
	for (i = 0; i < 4; i++) {
		if (h264_sub_mb_type(str, cabac, slice->slice_type, &mb->sub_mb_type[i])) return 1;
		pmode[i] = sub_mb_part_info[mb->sub_mb_type[i]][1];
		int sm = sub_mb_part_info[mb->sub_mb_type[i]][0];
		ifrom[i*4] = -1;
		switch (sm) {
			case 0:
				ifrom[i*4 + 1] = i*4;
				ifrom[i*4 + 2] = i*4;
				ifrom[i*4 + 3] = i*4;
				break;
			case 1:
				ifrom[i*4 + 1] = i*4;
				ifrom[i*4 + 2] = -1;
				ifrom[i*4 + 3] = i*4 + 2;
				break;
			case 2:
				ifrom[i*4 + 1] = -1;
				ifrom[i*4 + 2] = i*4;
				ifrom[i*4 + 3] = i*4 + 1;
				break;
			case 3:
				ifrom[i*4 + 1] = -1;
				ifrom[i*4 + 2] = -1;
				ifrom[i*4 + 3] = -1;
				break;
		}
	}
	int max = slice->num_ref_idx_l0_active_minus1;
	if (slice->mbaff_frame_flag && mb->mb_field_decoding_flag)
		max *= 2, max++;
	for (i = 0; i < 4; i++) {
		if (pmode[i] & 1 && mb->mb_type != H264_MB_TYPE_P_8X8REF0) {
			if (h264_ref_idx(str, cabac, i, 0, max, &mb->ref_idx[0][i])) return 1;
		} else {
			if (vs_infer(str, &mb->ref_idx[0][i], 0)) return 1;
		}
	}
	max = slice->num_ref_idx_l1_active_minus1;
	if (slice->mbaff_frame_flag && mb->mb_field_decoding_flag)
		max *= 2, max++;
	for (i = 0; i < 4; i++) {
		if (pmode[i] & 2) {
			if (h264_ref_idx(str, cabac, i, 1, max, &mb->ref_idx[1][i])) return 1;
		} else {
			if (vs_infer(str, &mb->ref_idx[1][i], 0)) return 1;
		}
	}
	for (i = 0; i < 16; i++) {
		if (ifrom[i] == -1) {
			if (pmode[i/4] & 1) {
				if (h264_mvd(str, cabac, i, 0, 0, &mb->mvd[0][i][0])) return 1;
				if (h264_mvd(str, cabac, i, 1, 0, &mb->mvd[0][i][1])) return 1;
			} else {
				if (vs_infers(str, &mb->mvd[0][i][0], 0)) return 1;
				if (vs_infers(str, &mb->mvd[0][i][1], 0)) return 1;
			}
		} else {
			if (vs_infers(str, &mb->mvd[0][i][0], mb->mvd[0][ifrom[i]][0])) return 1;
			if (vs_infers(str, &mb->mvd[0][i][1], mb->mvd[0][ifrom[i]][1])) return 1;
		}
	}
	for (i = 0; i < 16; i++) {
		if (ifrom[i] == -1) {
			if (pmode[i/4] & 2) {
				if (h264_mvd(str, cabac, i, 0, 1, &mb->mvd[1][i][0])) return 1;
				if (h264_mvd(str, cabac, i, 1, 1, &mb->mvd[1][i][1])) return 1;
			} else {
				if (vs_infers(str, &mb->mvd[1][i][0], 0)) return 1;
				if (vs_infers(str, &mb->mvd[1][i][1], 0)) return 1;
			}
		} else {
			if (vs_infers(str, &mb->mvd[1][i][0], mb->mvd[1][ifrom[i]][0])) return 1;
			if (vs_infers(str, &mb->mvd[1][i][1], mb->mvd[1][ifrom[i]][1])) return 1;
		}
	}
	if (vs_infer(str, &mb->intra_chroma_pred_mode, 0)) return 1;
	return 0;
}